

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

uint __thiscall
fmt::anon_unknown_1::WidthHandler::visit_any_int<unsigned_long_long>
          (WidthHandler *this,unsigned_long_long value)

{
  bool bVar1;
  CStringRef message;
  ulong in_RSI;
  long *in_RDI;
  UnsignedType width;
  FormatError *in_stack_ffffffffffffffb8;
  BasicCStringRef<char> local_20;
  ulong local_18;
  
  local_18 = in_RSI;
  bVar1 = internal::is_negative<unsigned_long_long>(0x1a1e2c);
  if (bVar1) {
    *(undefined4 *)(*in_RDI + 8) = 1;
    local_18 = -local_18;
  }
  if (local_18 < 0x80000000) {
    return (uint)local_18;
  }
  message.data_ = (char *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_20,"number is too big");
  FormatError::FormatError(in_stack_ffffffffffffffb8,message);
  __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

unsigned visit_any_int(T value) {
    typedef typename internal::IntTraits<T>::MainType UnsignedType;
    UnsignedType width = static_cast<UnsignedType>(value);
    if (internal::is_negative(value)) {
      spec_.align_ = ALIGN_LEFT;
      width = 0 - width;
    }
    if (width > INT_MAX)
      FMT_THROW(FormatError("number is too big"));
    return static_cast<unsigned>(width);
  }